

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# holding_property.cpp
# Opt level: O0

void __thiscall HoldingMovableType::HoldingMovableType(HoldingMovableType *this)

{
  HoldingMovableType *this_local;
  
  prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>::HoldingProperty<>
            (&this->value1);
  prop::HoldingProperty<HoldingMovableType,_Movable,_1UL,_prop::ReadWrite>::HoldingProperty<>
            (&this->value2);
  prop::HoldingProperty<HoldingMovableType,_Movable,_2UL,_prop::ReadOnly>::HoldingProperty<>
            (&this->ro_value);
  prop::HoldingProperty<HoldingMovableType,_IdHolder,_3UL,_prop::ReadWrite>::HoldingProperty<>
            (&this->value3);
  prop::HoldingProperty<HoldingMovableType,_IdHolder,_4UL,_prop::ReadOnly>::HoldingProperty<>
            (&this->ro_value2);
  return;
}

Assistant:

HoldingMovableType() = default;